

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManMonitor.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::DataManMonitor::AddLatencyMilliseconds
          (DataManMonitor *this,uint64_t remoteStamp)

{
  long lVar1;
  long in_RSI;
  deque<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  undefined1 auVar2 [16];
  uint64_t latency;
  uint64_t localStamp;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffffb8;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_30;
  rep local_28;
  duration<long,_std::ratio<1L,_1000L>_> local_20;
  rep local_18;
  long local_10;
  
  local_10 = in_RSI;
  local_30.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_28 = (rep)std::chrono::
                  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  ::time_since_epoch(&local_30);
  local_20.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                (in_stack_ffffffffffffffb8);
  local_18 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_20);
  lVar1 = (local_18 - local_10) -
          (long)in_RDI[4].super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Deque_impl_data._M_map;
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (in_RDI,(value_type *)in_stack_ffffffffffffffb8);
  auVar2._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar2._0_8_ = lVar1;
  auVar2._12_4_ = 0x45300000;
  in_RDI[4].super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last =
       (_Elt_pointer)
       ((auVar2._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0) +
       (double)in_RDI[4].super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Deque_impl_data._M_finish._M_last);
  return;
}

Assistant:

void DataManMonitor::AddLatencyMilliseconds(const uint64_t remoteStamp)
{
    uint64_t localStamp = std::chrono::duration_cast<std::chrono::milliseconds>(
                              std::chrono::system_clock::now().time_since_epoch())
                              .count();
    uint64_t latency = localStamp - remoteStamp - m_ClockError;
    m_LatencyMilliseconds.push_back(latency);
    m_AccumulatedLatency += latency;
}